

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O2

CURLcode cw_chunked_init(Curl_easy *data,Curl_cwriter *writer)

{
  undefined1 *puVar1;
  void *pvVar2;
  
  pvVar2 = writer->ctx;
  puVar1 = &(data->req).field_0xd9;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
  Curl_httpchunk_init(data,(Curl_chunker *)((long)pvVar2 + 0x20),false);
  return CURLE_OK;
}

Assistant:

static CURLcode cw_chunked_init(struct Curl_easy *data,
                                struct Curl_cwriter *writer)
{
  struct chunked_writer *ctx = writer->ctx;

  data->req.chunk = TRUE;      /* chunks coming our way. */
  Curl_httpchunk_init(data, &ctx->ch, FALSE);
  return CURLE_OK;
}